

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::ES2Types::ES2Types(ES2Types *this,Context *ctx)

{
  vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
  *this_00;
  value_type local_1b0;
  value_type local_1a8;
  value_type local_1a0;
  value_type local_198;
  value_type local_190;
  value_type local_188;
  value_type local_180;
  value_type local_178;
  Type **local_170;
  __normal_iterator<deqp::gls::LifetimeTests::details::Type_**,_std::vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>_>
  local_168;
  const_iterator local_160;
  Type *local_158;
  Type *types [6];
  Context *ctx_local;
  ES2Types *this_local;
  
  Types::Types(&this->super_Types,ctx);
  (this->super_Types)._vptr_Types = (_func_int **)&PTR_getProgramType_03287cc8;
  SimpleBinder::SimpleBinder(&this->m_bufferBind,ctx,0x27993d0,0,0x8892,true);
  SimpleType::SimpleType
            (&this->m_bufferType,ctx,"buffer",0x27b5510,0,(ExistsFunc)&this->m_bufferBind,
             (Binder *)glu::CallLogWrapper::glDeleteBuffers,false);
  SimpleBinder::SimpleBinder(&this->m_textureBind,ctx,0x279b020,0,0xde1,true);
  SimpleType::SimpleType
            (&this->m_textureType,ctx,"texture",0x27b62b0,0,(ExistsFunc)&this->m_textureBind,
             (Binder *)glu::CallLogWrapper::glDeleteTextures,false);
  SimpleBinder::SimpleBinder(&this->m_rboBind,ctx,0x279ab80,0,0x8d41,true);
  SimpleType::SimpleType
            (&this->m_rboType,ctx,"renderbuffer",0x27b5ed0,0,(ExistsFunc)&this->m_rboBind,
             (Binder *)glu::CallLogWrapper::glDeleteRenderbuffers,false);
  SimpleBinder::SimpleBinder(&this->m_fboBind,ctx,0x279a1e0,0,0x8d40,true);
  types[5] = (Type *)glu::CallLogWrapper::glIsFramebuffer;
  SimpleType::SimpleType
            (&this->m_fboType,ctx,"framebuffer",0x27b5780,0,(ExistsFunc)&this->m_fboBind,
             (Binder *)glu::CallLogWrapper::glDeleteFramebuffers,false);
  ShaderType::ShaderType(&this->m_shaderType,ctx);
  ProgramType::ProgramType(&this->m_programType,ctx);
  TextureFboAttacher::TextureFboAttacher
            (&this->m_texFboAtt,ctx,&(this->m_textureType).super_Type,&(this->m_fboType).super_Type)
  ;
  FboInputAttacher::FboInputAttacher(&this->m_texFboInAtt,&(this->m_texFboAtt).super_FboAttacher);
  FboOutputAttacher::FboOutputAttacher(&this->m_texFboOutAtt,&(this->m_texFboAtt).super_FboAttacher)
  ;
  RboFboAttacher::RboFboAttacher
            (&this->m_rboFboAtt,ctx,&(this->m_rboType).super_Type,&(this->m_fboType).super_Type);
  FboInputAttacher::FboInputAttacher(&this->m_rboFboInAtt,&(this->m_rboFboAtt).super_FboAttacher);
  FboOutputAttacher::FboOutputAttacher(&this->m_rboFboOutAtt,&(this->m_rboFboAtt).super_FboAttacher)
  ;
  ShaderProgramAttacher::ShaderProgramAttacher
            (&this->m_shaderAtt,ctx,&(this->m_shaderType).super_Type,
             &(this->m_programType).super_Type);
  ShaderProgramInputAttacher::ShaderProgramInputAttacher
            (&this->m_shaderInAtt,&(this->m_shaderAtt).super_Attacher);
  local_158 = &(this->m_bufferType).super_Type;
  types[0] = &(this->m_textureType).super_Type;
  types[1] = &(this->m_rboType).super_Type;
  types[2] = &(this->m_fboType).super_Type;
  types[3] = &(this->m_shaderType).super_Type;
  types[4] = &(this->m_programType).super_Type;
  this_00 = &(this->super_Types).m_types;
  local_168._M_current =
       (Type **)std::
                vector<deqp::gls::LifetimeTests::details::Type_*,_std::allocator<deqp::gls::LifetimeTests::details::Type_*>_>
                ::end(this_00);
  __gnu_cxx::
  __normal_iterator<deqp::gls::LifetimeTests::details::Type*const*,std::vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>>
  ::__normal_iterator<deqp::gls::LifetimeTests::details::Type**>
            ((__normal_iterator<deqp::gls::LifetimeTests::details::Type*const*,std::vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>>
              *)&local_160,&local_168);
  local_170 = (Type **)std::
                       vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
                       ::insert<deqp::gls::LifetimeTests::details::Type*const*,void>
                                 ((vector<deqp::gls::LifetimeTests::details::Type*,std::allocator<deqp::gls::LifetimeTests::details::Type*>>
                                   *)this_00,local_160,&local_158,types + 5);
  local_178 = (value_type)&this->m_texFboAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ::push_back(&(this->super_Types).m_attachers,&local_178);
  local_180 = (value_type)&this->m_rboFboAtt;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ::push_back(&(this->super_Types).m_attachers,&local_180);
  local_188 = &(this->m_shaderAtt).super_Attacher;
  std::
  vector<deqp::gls::LifetimeTests::details::Attacher_*,_std::allocator<deqp::gls::LifetimeTests::details::Attacher_*>_>
  ::push_back(&(this->super_Types).m_attachers,&local_188);
  local_190 = &(this->m_texFboInAtt).super_InputAttacher;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ::push_back(&(this->super_Types).m_inAttachers,&local_190);
  local_198 = &(this->m_rboFboInAtt).super_InputAttacher;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ::push_back(&(this->super_Types).m_inAttachers,&local_198);
  local_1a0 = &(this->m_shaderInAtt).super_InputAttacher;
  std::
  vector<deqp::gls::LifetimeTests::details::InputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::InputAttacher_*>_>
  ::push_back(&(this->super_Types).m_inAttachers,&local_1a0);
  local_1a8 = &(this->m_texFboOutAtt).super_OutputAttacher;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  ::push_back(&(this->super_Types).m_outAttachers,&local_1a8);
  local_1b0 = &(this->m_rboFboOutAtt).super_OutputAttacher;
  std::
  vector<deqp::gls::LifetimeTests::details::OutputAttacher_*,_std::allocator<deqp::gls::LifetimeTests::details::OutputAttacher_*>_>
  ::push_back(&(this->super_Types).m_outAttachers,&local_1b0);
  return;
}

Assistant:

ES2Types::ES2Types (const Context& ctx)
	: Types			(ctx)
	, m_bufferBind	(ctx, &CallLogWrapper::glBindBuffer,
					 GL_ARRAY_BUFFER, GL_ARRAY_BUFFER_BINDING)
	, m_bufferType	(ctx, "buffer", &CallLogWrapper::glGenBuffers,
					 &CallLogWrapper::glDeleteBuffers,
					 &CallLogWrapper::glIsBuffer, &m_bufferBind)
	, m_textureBind	(ctx, &CallLogWrapper::glBindTexture, GL_TEXTURE_2D, GL_TEXTURE_BINDING_2D)
	, m_textureType	(ctx, "texture", &CallLogWrapper::glGenTextures,
					 &CallLogWrapper::glDeleteTextures,
					 &CallLogWrapper::glIsTexture, &m_textureBind)
	, m_rboBind		(ctx, &CallLogWrapper::glBindRenderbuffer,
					 GL_RENDERBUFFER, GL_RENDERBUFFER_BINDING)
	, m_rboType		(ctx, "renderbuffer",
					 &CallLogWrapper::glGenRenderbuffers,
					 &CallLogWrapper::glDeleteRenderbuffers,
					 &CallLogWrapper::glIsRenderbuffer, &m_rboBind)
	, m_fboBind		(ctx, &CallLogWrapper::glBindFramebuffer,
					 GL_FRAMEBUFFER, GL_FRAMEBUFFER_BINDING)
	, m_fboType		(ctx, "framebuffer",
					 &CallLogWrapper::glGenFramebuffers,
					 &CallLogWrapper::glDeleteFramebuffers,
					 &CallLogWrapper::glIsFramebuffer, &m_fboBind)
	, m_shaderType	(ctx)
	, m_programType	(ctx)
	, m_texFboAtt	(ctx, m_textureType, m_fboType)
	, m_texFboInAtt	(m_texFboAtt)
	, m_texFboOutAtt(m_texFboAtt)
	, m_rboFboAtt	(ctx, m_rboType, m_fboType)
	, m_rboFboInAtt	(m_rboFboAtt)
	, m_rboFboOutAtt(m_rboFboAtt)
	, m_shaderAtt	(ctx, m_shaderType, m_programType)
	, m_shaderInAtt	(m_shaderAtt)
{
	Type* const types[] =
	{
		&m_bufferType, &m_textureType, &m_rboType, &m_fboType, &m_shaderType, &m_programType
	};
	m_types.insert(m_types.end(), DE_ARRAY_BEGIN(types), DE_ARRAY_END(types));

	m_attachers.push_back(&m_texFboAtt);
	m_attachers.push_back(&m_rboFboAtt);
	m_attachers.push_back(&m_shaderAtt);

	m_inAttachers.push_back(&m_texFboInAtt);
	m_inAttachers.push_back(&m_rboFboInAtt);
	m_inAttachers.push_back(&m_shaderInAtt);

	m_outAttachers.push_back(&m_texFboOutAtt);
	m_outAttachers.push_back(&m_rboFboOutAtt);
}